

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

_Bool sx_os_copy(char *src,char *dest)

{
  ssize_t sVar1;
  undefined1 local_b8 [4];
  int result;
  stat src_stat;
  int output;
  int input;
  char *dest_local;
  char *src_local;
  
  src_stat.__glibc_reserved[2]._4_4_ = open(src,0);
  if (src_stat.__glibc_reserved[2]._4_4_ == -1) {
    src_local._7_1_ = false;
  }
  else {
    fstat(src_stat.__glibc_reserved[2]._4_4_,(stat *)local_b8);
    src_stat.__glibc_reserved[2]._0_4_ = open(dest,0x41,(ulong)((uint)src_stat.st_nlink | 0x20000));
    if ((int)src_stat.__glibc_reserved[2] == -1) {
      close(src_stat.__glibc_reserved[2]._4_4_);
      src_local._7_1_ = false;
    }
    else {
      sVar1 = sendfile((int)src_stat.__glibc_reserved[2],src_stat.__glibc_reserved[2]._4_4_,
                       (off_t *)0x0,src_stat.st_rdev);
      close(src_stat.__glibc_reserved[2]._4_4_);
      close((int)src_stat.__glibc_reserved[2]);
      src_local._7_1_ = (uint)sVar1 < 0x80000000;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool sx_os_copy(const char* src, const char* dest)
{
#if SX_PLATFORM_WINDOWS
    return CopyFileA(src, dest, FALSE) ? true : false;
#elif SX_PLATFORM_APPLE
    return copyfile(src, dest, NULL, COPYFILE_ALL | COPYFILE_NOFOLLOW_DST) == 0;
#elif SX_PLATFORM_LINUX || SX_PLATFORM_ANDROID || SX_PLATFORM_RPI
    // Reference: http://www.informit.com/articles/article.aspx?p=23618&seqNum=13
    int input, output;
    struct stat src_stat;
    if ((input = open(src, O_RDONLY)) == -1) {
        return false;
    }
    fstat(input, &src_stat);

    if ((output = open(dest, O_WRONLY | O_CREAT, O_NOFOLLOW | src_stat.st_mode)) == -1) {
        close(input);
        return false;
    }

    int result = sendfile(output, input, NULL, src_stat.st_size);
    close(input);
    close(output);
    return result > -1;
#else
    sx_assert(0, "not implemented");
    return false;
#endif
}